

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::CuriosityChassis::CuriosityChassis
          (CuriosityChassis *this,string *name,CuriosityChassisType chassis_type,
          shared_ptr<chrono::ChMaterialSurface> *mat)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_108;
  ChVector<double> local_f8;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b8;
  
  ChFrame<double>::ChFrame(&local_b8,(ChVector<double> *)&VNULL,(ChQuaternion<double> *)&QUNIT);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_108,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  CuriosityPart::CuriosityPart
            (&this->super_CuriosityPart,name,&local_b8,
             (shared_ptr<chrono::ChMaterialSurface> *)&_Stack_108,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_108._M_refcount);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_001a09a0;
  *(CuriosityChassisType *)&(this->super_CuriosityPart).field_0x234 = chassis_type;
  if (chassis_type == FullRover) {
    (this->super_CuriosityPart).m_mass = 750.0;
    (this->super_CuriosityPart).m_inertia.m_data[0] = 637.5;
    (this->super_CuriosityPart).m_inertia.m_data[1] = 637.5;
    (this->super_CuriosityPart).m_inertia.m_data[2] = 750.0;
    local_d8.m_data[0] = 1.0;
    local_f8.m_data[2] = 0.0;
    local_d8.m_data[3] = 0.0;
    local_f8.m_data[0] = 0.0;
    local_f8.m_data[1] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    ChFrame<double>::ChFrame(&local_b8,&local_f8,&local_d8);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_b8);
  }
  else {
    if (chassis_type != Scarecrow) goto LAB_0016ec75;
    (this->super_CuriosityPart).m_mass = 200.0;
    (this->super_CuriosityPart).m_inertia.m_data[0] = 80.0;
    (this->super_CuriosityPart).m_inertia.m_data[1] = 80.0;
    (this->super_CuriosityPart).m_inertia.m_data[2] = 100.0;
    local_d8.m_data[0] = 1.0;
    local_f8.m_data[2] = 0.0;
    local_d8.m_data[3] = 0.0;
    local_f8.m_data[0] = 0.0;
    local_f8.m_data[1] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    ChFrame<double>::ChFrame(&local_b8,&local_f8,&local_d8);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_b8);
  }
  std::__cxx11::string::assign((char *)&(this->super_CuriosityPart).m_mesh_name);
LAB_0016ec75:
  auVar2._8_4_ = 0x3f800000;
  auVar2._0_8_ = 0x3f8000003f800000;
  auVar2._12_4_ = 0x3f800000;
  uVar1 = vmovlps_avx(auVar2);
  (this->super_CuriosityPart).m_color.R = (float)(int)uVar1;
  (this->super_CuriosityPart).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_CuriosityPart).m_color.B = 1.0;
  return;
}

Assistant:

CuriosityChassis::CuriosityChassis(const std::string& name,
                                   CuriosityChassisType chassis_type,
                                   std::shared_ptr<ChMaterialSurface> mat)
    : CuriosityPart(name, ChFrame<>(VNULL, QUNIT), mat, false), m_chassis_type(chassis_type) {
    switch (m_chassis_type) {
        case CuriosityChassisType::FullRover:
            m_mass = 750;
            m_inertia = ChVector<>(0.85, 0.85, 1.0) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "curiosity_chassis";
            break;

        case CuriosityChassisType::Scarecrow:
            m_mass = 200;
            m_inertia = ChVector<>(0.4, 0.4, 0.5) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "scarecrow_chassis";
            break;
    }
    m_color = ChColor(1.0f, 1.0f, 1.0f);
}